

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelside.cpp
# Opt level: O3

void __thiscall TPZGeoElSide::InsertConnectivity(TPZGeoElSide *this,TPZGeoElSide *neighbour)

{
  ulong uVar1;
  TPZGeoElSide neighl;
  TPZGeoElSide myl;
  TPZStack<int,_10> mylowerdimension;
  TPZStack<int,_10> neighbourlowerdimension;
  TPZGeoElSide local_f0;
  TPZGeoElSide local_d8;
  TPZManVector<int,_10> local_c0;
  TPZManVector<int,_10> local_78;
  
  if ((this->fGeoEl != (TPZGeoEl *)0x0) && (neighbour->fGeoEl != (TPZGeoEl *)0x0)) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_c0);
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    (**(code **)(*(long *)this->fGeoEl + 0x220))(this->fGeoEl,this->fSide,&local_c0);
    (**(code **)(*(long *)neighbour->fGeoEl + 0x220))(neighbour->fGeoEl,neighbour->fSide,&local_78);
    SetConnectivity(this,neighbour);
    if (0 < (int)(uint)local_c0.super_TPZVec<int>.fNElements) {
      uVar1 = 0;
      do {
        local_d8.fGeoEl = this->fGeoEl;
        local_d8.fSide = local_c0.super_TPZVec<int>.fStore[uVar1];
        local_d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
        local_f0.fGeoEl = neighbour->fGeoEl;
        local_f0.fSide = local_78.super_TPZVec<int>.fStore[uVar1];
        local_f0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
        SetConnectivity(&local_d8,&local_f0);
        uVar1 = uVar1 + 1;
      } while (((uint)local_c0.super_TPZVec<int>.fNElements & 0x7fffffff) != uVar1);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    TPZManVector<int,_10>::~TPZManVector(&local_c0);
  }
  return;
}

Assistant:

void TPZGeoElSide::InsertConnectivity(TPZGeoElSide &neighbour)
{
	if(!fGeoEl || !neighbour.fGeoEl) return;
	
	TPZStack<int> mylowerdimension, neighbourlowerdimension;
	fGeoEl->LowerDimensionSides(fSide,mylowerdimension);
	neighbour.fGeoEl->LowerDimensionSides(neighbour.fSide,neighbourlowerdimension);
	SetConnectivity(neighbour);
	int ns = mylowerdimension.NElements();
	int is;
	for(is=0; is<ns; is++)
	{
		TPZGeoElSide myl(fGeoEl,mylowerdimension[is]);
		TPZGeoElSide neighl(neighbour.fGeoEl,neighbourlowerdimension[is]);
#ifdef PZDEBUG
        std::set<int64_t> mynodes,neighnodes;
        int nsidenodes = myl.NSideNodes();
        for (int is = 0; is<nsidenodes; is++) {
            mynodes.insert(myl.SideNodeIndex(is));
            neighnodes.insert(neighl.SideNodeIndex(is));
        }
        if(mynodes != neighnodes) DebugStop();
#endif
		myl.SetConnectivity(neighl);
	}
}